

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O0

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)

{
  long local_18;
  SQInteger i;
  HSQUIRRELVM v_local;
  
  for (local_18 = 0; mathlib_funcs[local_18].name != (SQChar *)0x0; local_18 = local_18 + 1) {
    sq_pushstring(v,mathlib_funcs[local_18].name,-1);
    sq_newclosure(v,mathlib_funcs[local_18].f,0);
    sq_setparamscheck(v,mathlib_funcs[local_18].nparamscheck,mathlib_funcs[local_18].typemask);
    sq_setnativeclosurename(v,-1,mathlib_funcs[local_18].name);
    sq_newslot(v,-3,0);
  }
  sq_pushstring(v,"RAND_MAX",-1);
  sq_pushinteger(v,0x7fffffff);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"PI",-1);
  sq_pushfloat(v,3.1415927);
  sq_newslot(v,-3,0);
  return 0;
}

Assistant:

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(mathlib_funcs[i].name!=0) {
        sq_pushstring(v,mathlib_funcs[i].name,-1);
        sq_newclosure(v,mathlib_funcs[i].f,0);
        sq_setparamscheck(v,mathlib_funcs[i].nparamscheck,mathlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,mathlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_pushstring(v,_SC("RAND_MAX"),-1);
    sq_pushinteger(v,RAND_MAX);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("PI"),-1);
    sq_pushfloat(v,(SQFloat)M_PI);
    sq_newslot(v,-3,SQFalse);
    return SQ_OK;
}